

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wabtapi.cc
# Opt level: O3

Var create_module(Context *ctx,Module *module,bool validate)

{
  uchar *puVar1;
  CreateBufferFn p_Var2;
  Result RVar3;
  uint uVar4;
  Var pvVar5;
  undefined8 *puVar6;
  undefined1 local_58 [8];
  WriteBinaryOptions s_write_binary_options;
  undefined1 auStack_48 [8];
  Errors errors;
  __uniq_ptr_impl<wabt::OutputBuffer,_std::default_delete<wabt::OutputBuffer>_> local_28;
  
  if (module == (Module *)0x0) {
    puVar6 = (undefined8 *)__cxa_allocate_exception(8);
    *puVar6 = "No module found";
    __cxa_throw(puVar6,&ChakraWabt::WabtAPIError::typeinfo,0);
  }
  if (validate) {
    _local_58 = GetWabtFeatures(ctx->chakra);
    auStack_48 = (undefined1  [8])0x0;
    errors.super__Vector_base<wabt::Error,_std::allocator<wabt::Error>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    errors.super__Vector_base<wabt::Error,_std::allocator<wabt::Error>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    RVar3 = wabt::ValidateModule(module,(Errors *)auStack_48,(ValidateOptions *)local_58);
    CheckResult(RVar3,(Errors *)auStack_48,ctx->lexer,"Failed to validate module");
    std::vector<wabt::Error,_std::allocator<wabt::Error>_>::~vector
              ((vector<wabt::Error,_std::allocator<wabt::Error>_> *)auStack_48);
  }
  wabt::MemoryStream::MemoryStream((MemoryStream *)auStack_48,(Stream *)0x0);
  local_58[0] = true;
  local_58[1] = false;
  local_58[2] = false;
  RVar3 = wabt::WriteBinaryModule((Stream *)auStack_48,module,(WriteBinaryOptions *)local_58);
  if (RVar3.enum_ == Ok) {
    puVar1 = *(uchar **)
              local_28._M_t.
              super__Tuple_impl<0UL,_wabt::OutputBuffer_*,_std::default_delete<wabt::OutputBuffer>_>
              .super__Head_base<0UL,_wabt::OutputBuffer_*,_false>._M_head_impl;
    p_Var2 = ctx->chakra->createBuffer;
    uVar4 = TruncSizeT(*(long *)((long)local_28._M_t.
                                       super__Tuple_impl<0UL,_wabt::OutputBuffer_*,_std::default_delete<wabt::OutputBuffer>_>
                                       .super__Head_base<0UL,_wabt::OutputBuffer_*,_false>.
                                       _M_head_impl + 8) - (long)puVar1);
    pvVar5 = (*p_Var2)(puVar1,uVar4,ctx->chakra->user_data);
    auStack_48 = (undefined1  [8])&PTR__MemoryStream_01546618;
    if ((__uniq_ptr_impl<wabt::OutputBuffer,_std::default_delete<wabt::OutputBuffer>_>)
        local_28._M_t.
        super__Tuple_impl<0UL,_wabt::OutputBuffer_*,_std::default_delete<wabt::OutputBuffer>_>.
        super__Head_base<0UL,_wabt::OutputBuffer_*,_false>._M_head_impl !=
        (__uniq_ptr_impl<wabt::OutputBuffer,_std::default_delete<wabt::OutputBuffer>_>)0x0) {
      if (*(void **)local_28._M_t.
                    super__Tuple_impl<0UL,_wabt::OutputBuffer_*,_std::default_delete<wabt::OutputBuffer>_>
                    .super__Head_base<0UL,_wabt::OutputBuffer_*,_false>._M_head_impl != (void *)0x0)
      {
        operator_delete(*(void **)local_28._M_t.
                                  super__Tuple_impl<0UL,_wabt::OutputBuffer_*,_std::default_delete<wabt::OutputBuffer>_>
                                  .super__Head_base<0UL,_wabt::OutputBuffer_*,_false>._M_head_impl);
      }
      operator_delete((void *)local_28._M_t.
                              super__Tuple_impl<0UL,_wabt::OutputBuffer_*,_std::default_delete<wabt::OutputBuffer>_>
                              .super__Head_base<0UL,_wabt::OutputBuffer_*,_false>._M_head_impl);
    }
    return pvVar5;
  }
  puVar6 = (undefined8 *)__cxa_allocate_exception(8);
  *puVar6 = "Error while writing module";
  __cxa_throw(puVar6,&ChakraWabt::WabtAPIError::typeinfo,0);
}

Assistant:

Js::Var create_module(Context* ctx, const Module* module, bool validate = true)
{
    if (!module)
    {
        throw WabtAPIError("No module found");
    }
    if (validate)
    {
        ValidateOptions options(GetWabtFeatures(*ctx->chakra));
        Errors errors;
        Result result = ValidateModule(module, &errors, options);
        CheckResult(result, &errors, ctx->lexer, "Failed to validate module");
    }
    MemoryStream stream;
    WriteBinaryOptions s_write_binary_options;
    Result result = WriteBinaryModule(&stream, module, s_write_binary_options);
    if (!Succeeded(result))
    {
        throw WabtAPIError("Error while writing module");
    }
    const uint8_t* data = stream.output_buffer().data.data();
    const size_t size = stream.output_buffer().size();
    return ctx->chakra->createBuffer(data, TruncSizeT(size), ctx->chakra->user_data);
}